

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.h
# Opt level: O1

object pybind11::eval<(pybind11::eval_mode)0>(str *expr,object *global,object *local)

{
  long *plVar1;
  PyObject *pPVar2;
  error_already_set *this;
  object *in_RCX;
  long *plVar3;
  undefined8 in_R9;
  string buffer;
  long *plVar4;
  long lVar5;
  long local_58;
  long lStack_50;
  string local_48;
  
  if ((in_RCX->super_handle).m_ptr == (PyObject *)0x0) {
    object::operator=(in_RCX,local);
  }
  str::operator_cast_to_string(&local_48,(str *)global);
  plVar1 = (long *)std::__cxx11::string::replace((ulong)&local_48,0,(char *)0x0,0x1132c4);
  plVar3 = plVar1 + 2;
  if ((long *)*plVar1 == plVar3) {
    local_58 = *plVar3;
    lStack_50 = plVar1[3];
    plVar4 = &local_58;
  }
  else {
    local_58 = *plVar3;
    plVar4 = (long *)*plVar1;
  }
  lVar5 = plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  pPVar2 = (PyObject *)
           PyRun_StringFlags(plVar4,0x102,(local->super_handle).m_ptr,(in_RCX->super_handle).m_ptr,0
                             ,in_R9,plVar4,lVar5);
  if (pPVar2 != (PyObject *)0x0) {
    (expr->super_object).super_handle.m_ptr = pPVar2;
    if (plVar4 != &local_58) {
      operator_delete(plVar4,local_58 + 1);
    }
    return (object)(handle)expr;
  }
  this = (error_already_set *)__cxa_allocate_exception(0x28);
  error_already_set::error_already_set(this);
  __cxa_throw(this,&error_already_set::typeinfo,error_already_set::~error_already_set);
}

Assistant:

object eval(str expr, object global = globals(), object local = object()) {
    if (!local)
        local = global;

    /* PyRun_String does not accept a PyObject / encoding specifier,
       this seems to be the only alternative */
    std::string buffer = "# -*- coding: utf-8 -*-\n" + (std::string) expr;

    int start;
    switch (mode) {
        case eval_expr:             start = Py_eval_input;   break;
        case eval_single_statement: start = Py_single_input; break;
        case eval_statements:       start = Py_file_input;   break;
        default: pybind11_fail("invalid evaluation mode");
    }

    PyObject *result = PyRun_String(buffer.c_str(), start, global.ptr(), local.ptr());
    if (!result)
        throw error_already_set();
    return reinterpret_steal<object>(result);
}